

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O3

void ucnv_fromUnicode_UTF8_OFFSETS_LOGIC_63(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UChar UVar2;
  UConverter *pUVar3;
  UChar *pUVar4;
  byte *pbVar5;
  int *piVar6;
  UChar *pUVar7;
  byte *pbVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  byte *pbVar17;
  byte local_44 [4];
  UConverterSharedData *local_40;
  UConverterFromUnicodeArgs *local_38;
  uint8_t tempBuf [4];
  
  pUVar3 = args->converter;
  pUVar7 = args->source;
  piVar6 = args->offsets;
  pUVar4 = args->sourceLimit;
  pbVar8 = (byte *)args->target;
  local_38 = args;
  pbVar5 = (byte *)args->targetLimit;
  local_40 = pUVar3->sharedData;
  uVar16 = pUVar3->fromUChar32;
  iVar9 = 0;
  if (pbVar5 <= pbVar8 || uVar16 == 0) goto LAB_0016a63b;
  pUVar3->fromUChar32 = 0;
  iVar11 = 0;
  iVar9 = -1;
  do {
    if (pUVar4 <= pUVar7) {
      pUVar3->fromUChar32 = uVar16;
LAB_0016a835:
      if ((pUVar7 < pUVar4) && ((pbVar5 <= pbVar8 && (*err < U_ILLEGAL_ARGUMENT_ERROR)))) {
        *err = U_BUFFER_OVERFLOW_ERROR;
      }
      local_38->target = (char *)pbVar8;
      local_38->source = pUVar7;
      local_38->offsets = piVar6;
      return;
    }
    if (((uVar16 >> 10 & 1) != 0) || (((ushort)*pUVar7 & 0xfc00) != 0xdc00)) {
      pUVar3->fromUChar32 = uVar16;
      *err = U_ILLEGAL_CHAR_FOUND;
      goto LAB_0016a835;
    }
    uVar16 = uVar16 * 0x400 + (uint)(ushort)*pUVar7 + 0xfca02400;
    pUVar7 = pUVar7 + 1;
    iVar10 = iVar9;
    iVar11 = iVar11 + 1;
    do {
      iVar9 = iVar11;
      pbVar17 = local_44;
      if (3 < (long)pbVar5 - (long)pbVar8) {
        pbVar17 = pbVar8;
      }
      if ((int)uVar16 < 0x10000) {
        bVar15 = (byte)(uVar16 >> 0xc) | 0xe0;
        uVar12 = 2;
      }
      else {
        bVar15 = (byte)(uVar16 >> 0x12) | 0xf0;
        pbVar13 = local_44;
        if (3 < (long)pbVar5 - (long)pbVar8) {
          pbVar13 = pbVar8;
        }
        pbVar13[1] = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
        uVar12 = 3;
      }
      *pbVar17 = bVar15;
      uVar14 = (ulong)uVar12;
      pbVar17[uVar14 - 1] = (byte)(uVar16 >> 6) & 0x3f | 0x80;
      pbVar17[uVar14] = (byte)uVar16 & 0x3f | 0x80;
      if (pbVar17 == pbVar8) {
        pbVar8 = pbVar8 + uVar14 + 1;
        *piVar6 = iVar10;
        piVar6[1] = iVar10;
        piVar6[2] = iVar10;
        if (0xffff < (int)uVar16) {
          piVar6[3] = iVar10;
        }
        piVar6 = piVar6 + uVar14 + 1;
      }
      else {
        for (; pbVar17 <= local_44 + uVar14; pbVar17 = pbVar17 + 1) {
          if (pbVar8 < pbVar5) {
            *piVar6 = iVar10;
            piVar6 = piVar6 + 1;
            *pbVar8 = *pbVar17;
            pbVar8 = pbVar8 + 1;
          }
          else {
            bVar15 = *pbVar17;
            cVar1 = pUVar3->charErrorBufferLength;
            pUVar3->charErrorBufferLength = cVar1 + '\x01';
            pUVar3->charErrorBuffer[cVar1] = bVar15;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
        }
      }
LAB_0016a63b:
      while( true ) {
        while( true ) {
          if ((pUVar4 <= pUVar7) || (pbVar5 <= pbVar8)) goto LAB_0016a835;
          UVar2 = *pUVar7;
          uVar16 = (uint)(ushort)UVar2;
          pUVar7 = pUVar7 + 1;
          bVar15 = (byte)UVar2;
          if (0x7f < uVar16) break;
          *piVar6 = iVar9;
          piVar6 = piVar6 + 1;
          iVar9 = iVar9 + 1;
          *pbVar8 = bVar15;
          pbVar8 = pbVar8 + 1;
        }
        if (0x7ff < uVar16) break;
        *piVar6 = iVar9;
        *pbVar8 = (byte)((ushort)UVar2 >> 6) | 0xc0;
        if (pbVar8 + 1 < pbVar5) {
          piVar6[1] = iVar9;
          piVar6 = piVar6 + 2;
          iVar9 = iVar9 + 1;
          pbVar8[1] = bVar15 & 0x3f | 0x80;
          pbVar8 = pbVar8 + 2;
        }
        else {
          piVar6 = piVar6 + 1;
          pUVar3->charErrorBuffer[0] = bVar15 & 0x3f | 0x80;
          pUVar3->charErrorBufferLength = '\x01';
          *err = U_BUFFER_OVERFLOW_ERROR;
          pbVar8 = pbVar8 + 1;
        }
      }
      iVar11 = iVar9 + 1;
      iVar10 = iVar9;
    } while ((local_40 == &_CESU8Data_63) || ((uVar16 & 0xf800) != 0xd800));
  } while( true );
}

Assistant:

U_CFUNC void  U_CALLCONV ucnv_fromUnicode_UTF8_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                  UErrorCode * err)
{
    UConverter *cnv = args->converter;
    const UChar *mySource = args->source;
    int32_t *myOffsets = args->offsets;
    const UChar *sourceLimit = args->sourceLimit;
    uint8_t *myTarget = (uint8_t *) args->target;
    const uint8_t *targetLimit = (uint8_t *) args->targetLimit;
    uint8_t *tempPtr;
    UChar32 ch;
    int32_t offsetNum, nextSourceIndex;
    int32_t indexToWrite;
    uint8_t tempBuf[4];
    UBool isNotCESU8 = !hasCESU8Data(cnv);

    if (cnv->fromUChar32 && myTarget < targetLimit)
    {
        ch = cnv->fromUChar32;
        cnv->fromUChar32 = 0;
        offsetNum = -1;
        nextSourceIndex = 0;
        goto lowsurrogate;
    } else {
        offsetNum = 0;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);

        if (ch < 0x80)        /* Single byte */
        {
            *(myOffsets++) = offsetNum++;
            *(myTarget++) = (char) ch;
        }
        else if (ch < 0x800)  /* Double byte */
        {
            *(myOffsets++) = offsetNum;
            *(myTarget++) = (uint8_t) ((ch >> 6) | 0xc0);
            if (myTarget < targetLimit)
            {
                *(myOffsets++) = offsetNum++;
                *(myTarget++) = (uint8_t) ((ch & 0x3f) | 0x80);
            }
            else
            {
                cnv->charErrorBuffer[0] = (uint8_t) ((ch & 0x3f) | 0x80);
                cnv->charErrorBufferLength = 1;
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
        else
        /* Check for surrogates */
        {
            nextSourceIndex = offsetNum + 1;

            if(U16_IS_SURROGATE(ch) && isNotCESU8) {
lowsurrogate:
                if (mySource < sourceLimit) {
                    /* test both code units */
                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(*mySource)) {
                        /* convert and consume this supplementary code point */
                        ch=U16_GET_SUPPLEMENTARY(ch, *mySource);
                        ++mySource;
                        ++nextSourceIndex;
                        /* exit this condition tree */
                    }
                    else {
                        /* this is an unpaired trail or lead code unit */
                        /* callback(illegal) */
                        cnv->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* no more input */
                    cnv->fromUChar32 = ch;
                    break;
                }
            }

            /* Do we write the buffer directly for speed,
            or do we have to be careful about target buffer space? */
            tempPtr = (((targetLimit - myTarget) >= 4) ? myTarget : tempBuf);

            if (ch <= MAXIMUM_UCS2) {
                indexToWrite = 2;
                tempPtr[0] = (uint8_t) ((ch >> 12) | 0xe0);
            }
            else {
                indexToWrite = 3;
                tempPtr[0] = (uint8_t) ((ch >> 18) | 0xf0);
                tempPtr[1] = (uint8_t) (((ch >> 12) & 0x3f) | 0x80);
            }
            tempPtr[indexToWrite-1] = (uint8_t) (((ch >> 6) & 0x3f) | 0x80);
            tempPtr[indexToWrite] = (uint8_t) ((ch & 0x3f) | 0x80);

            if (tempPtr == myTarget) {
                /* There was enough space to write the codepoint directly. */
                myTarget += (indexToWrite + 1);
                myOffsets[0] = offsetNum;
                myOffsets[1] = offsetNum;
                myOffsets[2] = offsetNum;
                if (indexToWrite >= 3) {
                    myOffsets[3] = offsetNum;
                }
                myOffsets += (indexToWrite + 1);
            }
            else {
                /* We might run out of room soon. Write it slowly. */
                for (; tempPtr <= (tempBuf + indexToWrite); tempPtr++) {
                    if (myTarget < targetLimit)
                    {
                        *(myOffsets++) = offsetNum;
                        *(myTarget++) = *tempPtr;
                    }
                    else
                    {
                        cnv->charErrorBuffer[cnv->charErrorBufferLength++] = *tempPtr;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }
            }
            offsetNum = nextSourceIndex;
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
    args->offsets = myOffsets;
}